

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void cpool_perform(cpool *cpool)

{
  Curl_easy *data;
  Curl_llist_node *n;
  Curl_llist_node *pCVar1;
  connectdata *conn;
  timediff_t tVar2;
  long lVar3;
  curltime *nowp;
  long milli;
  curltime cVar4;
  _Bool done;
  _Bool local_49;
  cpool *local_48;
  curltime local_40;
  
  data = cpool->idata;
  local_48 = cpool;
  n = Curl_llist_head(&cpool->shutdowns);
  if (n != (Curl_llist_node *)0x0) {
    nowp = (curltime *)0x0;
    milli = 0;
    do {
      pCVar1 = Curl_node_next(n);
      conn = (connectdata *)Curl_node_elem(n);
      Curl_attach_connection(data,conn);
      cpool_run_conn_shutdown(data,conn,&local_49);
      Curl_detach_connection(data);
      if (local_49 == true) {
        Curl_node_remove(n);
        cpool_close_and_destroy(local_48,conn,(Curl_easy *)0x0,false);
      }
      else {
        if (nowp == (curltime *)0x0) {
          cVar4 = Curl_now();
          local_40.tv_sec = cVar4.tv_sec;
          local_40.tv_usec = cVar4.tv_usec;
          nowp = &local_40;
        }
        tVar2 = Curl_conn_shutdown_timeleft(conn,nowp);
        lVar3 = milli;
        if (tVar2 < milli) {
          lVar3 = tVar2;
        }
        if (tVar2 != 0) {
          milli = lVar3;
        }
      }
      n = pCVar1;
    } while (pCVar1 != (Curl_llist_node *)0x0);
    if (milli != 0) {
      Curl_expire(data,milli,EXPIRE_RUN_NOW);
    }
  }
  return;
}

Assistant:

static void cpool_perform(struct cpool *cpool)
{
  struct Curl_easy *data = cpool->idata;
  struct Curl_llist_node *e = Curl_llist_head(&cpool->shutdowns);
  struct Curl_llist_node *enext;
  struct connectdata *conn;
  struct curltime *nowp = NULL;
  struct curltime now;
  timediff_t next_from_now_ms = 0, ms;
  bool done;

  if(!e)
    return;

  DEBUGASSERT(data);
  DEBUGF(infof(data, "[CCACHE] perform, %zu connections being shutdown",
               Curl_llist_count(&cpool->shutdowns)));
  while(e) {
    enext = Curl_node_next(e);
    conn = Curl_node_elem(e);
    Curl_attach_connection(data, conn);
    cpool_run_conn_shutdown(data, conn, &done);
    DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                 conn->connection_id, done));
    Curl_detach_connection(data);
    if(done) {
      Curl_node_remove(e);
      cpool_close_and_destroy(cpool, conn, NULL, FALSE);
    }
    else {
      /* Not done, when does this connection time out? */
      if(!nowp) {
        now = Curl_now();
        nowp = &now;
      }
      ms = Curl_conn_shutdown_timeleft(conn, nowp);
      if(ms && ms < next_from_now_ms)
        next_from_now_ms = ms;
    }
    e = enext;
  }

  if(next_from_now_ms)
    Curl_expire(data, next_from_now_ms, EXPIRE_RUN_NOW);
}